

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O3

int can_update_sample_point_v6_3
              (can_bittiming_const *btc,uint sample_point_nominal,uint tseg,uint *tseg1_ptr,
              uint *tseg2_ptr,uint *sample_point_error_ptr)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  uVar1 = tseg + 1;
  uVar8 = 0;
  uVar13 = 0xffffffff;
  iVar6 = 0;
  bVar5 = true;
  do {
    bVar10 = bVar5;
    uVar9 = uVar1 - (iVar6 + (uVar1 * sample_point_nominal) / 1000);
    uVar2 = btc->tseg1_max;
    if (uVar9 <= btc->tseg2_min) {
      uVar9 = btc->tseg2_min;
    }
    if (btc->tseg2_max <= uVar9) {
      uVar9 = btc->tseg2_max;
    }
    uVar12 = tseg - uVar9;
    uVar4 = tseg - uVar2;
    if (uVar12 <= uVar2) {
      uVar4 = uVar9;
    }
    uVar3 = (ulong)((uVar1 - uVar4) * 1000) / (ulong)uVar1;
    uVar7 = (uint)uVar3;
    uVar11 = sample_point_nominal - uVar7;
    uVar9 = -uVar11;
    if (0 < (int)uVar11) {
      uVar9 = uVar11;
    }
    if (uVar9 < uVar13 && uVar7 <= sample_point_nominal) {
      if (uVar12 < uVar2) {
        uVar2 = uVar12;
      }
      *tseg1_ptr = uVar2;
      *tseg2_ptr = uVar4;
      uVar8 = uVar3;
      uVar13 = uVar9;
    }
    iVar6 = 1;
    bVar5 = false;
  } while (bVar10);
  if (sample_point_error_ptr != (uint *)0x0) {
    *sample_point_error_ptr = uVar13;
  }
  return (int)uVar8;
}

Assistant:

static int
can_update_sample_point(const struct can_bittiming_const *btc,
			const unsigned int sample_point_nominal, const unsigned int tseg,
			unsigned int *tseg1_ptr, unsigned int *tseg2_ptr,
			unsigned int *sample_point_error_ptr)
{
	unsigned int sample_point_error, best_sample_point_error = UINT_MAX;
	unsigned int sample_point, best_sample_point = 0;
	unsigned int tseg1, tseg2;
	int i;

	for (i = 0; i <= 1; i++) {
		tseg2 = tseg + CAN_SYNC_SEG -
			(sample_point_nominal * (tseg + CAN_SYNC_SEG)) /
			1000 - i;
		tseg2 = clamp(tseg2, btc->tseg2_min, btc->tseg2_max);
		tseg1 = tseg - tseg2;
		if (tseg1 > btc->tseg1_max) {
			tseg1 = btc->tseg1_max;
			tseg2 = tseg - tseg1;
		}

		sample_point = 1000 * (tseg + CAN_SYNC_SEG - tseg2) /
			(tseg + CAN_SYNC_SEG);
		sample_point_error = abs(sample_point_nominal - sample_point);

		if (sample_point <= sample_point_nominal &&
		    sample_point_error < best_sample_point_error) {
			best_sample_point = sample_point;
			best_sample_point_error = sample_point_error;
			*tseg1_ptr = tseg1;
			*tseg2_ptr = tseg2;
		}
	}

	if (sample_point_error_ptr)
		*sample_point_error_ptr = best_sample_point_error;

	return best_sample_point;
}